

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv__io_fork(uv_loop_t *loop)

{
  void *old_watchers;
  int iVar1;
  
  old_watchers = loop->inotify_watchers;
  uv__close(loop->backend_fd);
  loop->backend_fd = -1;
  uv__platform_loop_delete(loop);
  loop->inotify_fd = -1;
  loop->inotify_watchers = (void *)0x0;
  iVar1 = uv__epoll_init(loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv__inotify_fork(loop,old_watchers);
  return iVar1;
}

Assistant:

int uv__io_fork(uv_loop_t* loop) {
  int err;
  void* old_watchers;

  old_watchers = loop->inotify_watchers;

  uv__close(loop->backend_fd);
  loop->backend_fd = -1;
  uv__platform_loop_delete(loop);

  err = uv__platform_loop_init(loop);
  if (err)
    return err;

  return uv__inotify_fork(loop, old_watchers);
}